

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# varintdecode.c
# Opt level: O1

size_t read_intsAVX2(uint8_t *in,uint32_t *out,int length)

{
  byte bVar1;
  ushort uVar2;
  undefined1 auVar3 [32];
  int iVar4;
  byte bVar5;
  uint uVar6;
  ulong uVar7;
  int iVar8;
  long lVar9;
  size_t sVar10;
  uint32_t *out_00;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  
  if (length < 0x10) {
    sVar10 = 0;
    uVar6 = 0;
  }
  else {
    uVar7 = 0;
    auVar12._8_8_ = 0x3f803f803f803f80;
    auVar12._0_8_ = 0x3f803f803f803f80;
    auVar13._8_8_ = 0x7f007f007f007f;
    auVar13._0_8_ = 0x7f007f007f007f;
    auVar14._8_8_ = 0x3fff00003fff;
    auVar14._0_8_ = 0x3fff00003fff;
    auVar15._8_8_ = 0x3f8000003f80;
    auVar15._0_8_ = 0x3f8000003f80;
    auVar16._8_8_ = 0x7f0000007f;
    auVar16._0_8_ = 0x7f0000007f;
    auVar17._8_8_ = 0x1fc000001fc000;
    auVar17._0_8_ = 0x1fc000001fc000;
    auVar18[8] = 0x7f;
    auVar18._0_8_ = 0x7f7f7f7f7f7f7f7f;
    auVar18[9] = 0x7f;
    auVar18[10] = 0x7f;
    auVar18[0xb] = 0x7f;
    auVar18[0xc] = 0x7f;
    auVar18[0xd] = 0x7f;
    auVar18[0xe] = 0x7f;
    auVar18[0xf] = 0x7f;
    auVar19._8_8_ = 0x4000500060007;
    auVar19._0_8_ = 0x4000500060007;
    sVar10 = 0;
    do {
      auVar20 = vlddqu_avx(*(undefined1 (*) [16])(in + sVar10));
      uVar2 = (ushort)(SUB161(auVar20 >> 7,0) & 1) | (ushort)(SUB161(auVar20 >> 0xf,0) & 1) << 1 |
              (ushort)(SUB161(auVar20 >> 0x17,0) & 1) << 2 |
              (ushort)(SUB161(auVar20 >> 0x1f,0) & 1) << 3 |
              (ushort)(SUB161(auVar20 >> 0x27,0) & 1) << 4 |
              (ushort)(SUB161(auVar20 >> 0x2f,0) & 1) << 5 |
              (ushort)(SUB161(auVar20 >> 0x37,0) & 1) << 6 |
              (ushort)(SUB161(auVar20 >> 0x3f,0) & 1) << 7 |
              (ushort)(SUB161(auVar20 >> 0x47,0) & 1) << 8 |
              (ushort)(SUB161(auVar20 >> 0x4f,0) & 1) << 9 |
              (ushort)(SUB161(auVar20 >> 0x57,0) & 1) << 10 |
              (ushort)(SUB161(auVar20 >> 0x5f,0) & 1) << 0xb |
              (ushort)(SUB161(auVar20 >> 0x67,0) & 1) << 0xc |
              (ushort)(SUB161(auVar20 >> 0x6f,0) & 1) << 0xd |
              (ushort)(SUB161(auVar20 >> 0x77,0) & 1) << 0xe |
              (ushort)(byte)(auVar20[0xf] >> 7) << 0xf;
      if (uVar2 == 0) {
        auVar3 = vpmovsxbd_avx2(auVar20);
        *(undefined1 (*) [32])(out + uVar7) = auVar3;
        auVar20 = vpshufd_avx(auVar20,0xee);
        auVar3 = vpmovsxbd_avx2(auVar20);
        *(undefined1 (*) [32])(out + uVar7 + 8) = auVar3;
        bVar5 = 0x10;
        iVar8 = 0x10;
      }
      else {
        uVar6 = uVar2 & 0xfff;
        bVar1 = combined_lookup[uVar6].index;
        bVar5 = combined_lookup[uVar6].bytes_consumed;
        auVar11 = *(undefined1 (*) [16])("" + (ulong)bVar1 * 0x10);
        if (bVar1 < 0x40) {
          auVar11 = vpshufb_avx(auVar20,auVar11);
          auVar20 = vpsrlw_avx(auVar11,1);
          auVar20 = vpand_avx(auVar20,auVar12);
          auVar11 = vpternlogq_avx512vl(auVar20,auVar11,auVar13,0xf8);
          auVar20 = vpand_avx(auVar11,auVar14);
          *(undefined1 (*) [16])(out + uVar7) = auVar20;
          auVar20 = vpsrld_avx(auVar11,0x10);
          *(long *)(out + uVar7 + 4) = auVar20._0_8_;
          iVar8 = 6;
        }
        else if (bVar1 < 0x91) {
          auVar11 = vpshufb_avx(auVar20,auVar11);
          auVar20 = vpsrld_avx(auVar11,1);
          auVar20 = vpand_avx(auVar20,auVar15);
          auVar21 = vpsrld_avx(auVar11,2);
          auVar20 = vpternlogq_avx512vl(auVar20,auVar11,auVar16,0xf8);
          auVar20 = vpternlogq_avx512vl(auVar20,auVar21,auVar17,0xf8);
          *(undefined1 (*) [16])(out + uVar7) = auVar20;
          iVar8 = 4;
        }
        else {
          auVar20 = vpand_avx(auVar20,auVar18);
          auVar20 = vpshufb_avx(auVar20,auVar11);
          auVar11 = vpsllvw_avx512vl(auVar20,auVar19);
          auVar20 = vpshldq_avx512_vbmi2(auVar11,auVar20,8);
          auVar20 = vpor_avx(auVar20,auVar11);
          auVar20 = vpmovwb_avx512vl(auVar20);
          *(long *)(out + uVar7) = auVar20._0_8_;
          iVar8 = 2;
        }
      }
      sVar10 = sVar10 + bVar5;
      iVar4 = (int)uVar7;
      uVar6 = iVar8 + iVar4;
      uVar7 = (ulong)uVar6;
    } while (iVar8 + 0xf + iVar4 < length);
  }
  if ((int)uVar6 < length) {
    out_00 = out + uVar6;
    lVar9 = (ulong)(uint)length - (ulong)uVar6;
    do {
      uVar6 = read_int(in + sVar10,out_00);
      sVar10 = sVar10 + uVar6;
      out_00 = out_00 + 1;
      lVar9 = lVar9 + -1;
    } while (lVar9 != 0);
  }
  return sVar10;
}

Assistant:

size_t read_intsAVX2(const uint8_t *in, uint32_t *out, int length) {
  size_t consumed = 0;
  int count;
  for (count = 0; count + 15 < length;) {
    int ints_read;
    consumed += read_int_groupAVX2(in + consumed, out + count, &ints_read);
    count += ints_read;
  }
  for (; count < length; count++) {
    consumed += read_int(in + consumed, out + count);
  }
  return consumed;
}